

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O1

void __thiscall
capnp::compiler::NodeTranslator::compileNode(NodeTranslator *this,Reader decl,Builder builder)

{
  Reader nestedDecls;
  Reader annotations;
  Reader members;
  bool bVar1;
  Which parentKind;
  undefined2 uVar2;
  undefined4 uVar3;
  PointerType PVar4;
  uint32_t uVar5;
  WirePointer WVar6;
  undefined4 uVar7;
  uint uVar8;
  unsigned_long i;
  ulong uVar9;
  size_t sVar10;
  ulong uVar11;
  char *pcVar12;
  Reader RVar13;
  StringPtr targetsFlagName;
  Fault f;
  BuilderFor<capnp::schema::Node::SourceInfo> di;
  Reader genericParams;
  StructReader local_208;
  uint local_1cc;
  undefined1 local_1c8 [40];
  PointerReader local_1a0;
  DuplicateNameDetector local_180;
  ListReader local_148;
  StructBuilder local_118;
  ListReader local_f0;
  ListReader local_c0;
  ListReader local_90;
  ListReader local_60;
  
  local_180.errorReporter = this->errorReporter;
  local_180.names._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_180.names._M_t._M_impl.super__Rb_tree_header._M_header;
  local_180.names._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_180.names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_180.names._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_208.data = (WirePointer *)0x0;
  local_208.capTable = (CapTableReader *)0x0;
  local_208.segment = (SegmentReader *)0x0;
  local_208.pointers._0_4_ = 0x7fffffff;
  if (2 < decl._reader.pointerCount) {
    local_208.data = decl._reader.pointers + 2;
    local_208.capTable = decl._reader.capTable;
    local_208.segment = decl._reader.segment;
    local_208.pointers._0_4_ = decl._reader.nestingLimit;
  }
  local_180.names._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_180.names._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  capnp::_::PointerReader::getList
            (&local_148,(PointerReader *)&local_208,INLINE_COMPOSITE,(word *)0x0);
  if (decl._reader.dataSize < 0x20) {
    parentKind = FILE;
  }
  else {
    parentKind = *(Which *)((long)decl._reader.data + 2);
  }
  uVar7 = local_148._36_4_;
  nestedDecls.reader.capTable._0_4_ = (int)local_148.capTable;
  nestedDecls.reader.segment = local_148.segment;
  nestedDecls.reader.capTable._4_4_ = (int)((ulong)local_148.capTable >> 0x20);
  nestedDecls.reader.ptr._0_4_ = (int)local_148.ptr;
  nestedDecls.reader.ptr._4_4_ = (int)((ulong)local_148.ptr >> 0x20);
  nestedDecls.reader.elementCount = local_148.elementCount;
  nestedDecls.reader.step = local_148.step;
  nestedDecls.reader.structDataSize = local_148.structDataSize;
  nestedDecls.reader.structPointerCount = (short)uVar7;
  nestedDecls.reader.elementSize = (char)((uint)uVar7 >> 0x10);
  nestedDecls.reader._39_1_ = (char)((uint)uVar7 >> 0x18);
  nestedDecls.reader.nestingLimit = local_148.nestingLimit;
  nestedDecls.reader._44_4_ = local_148._44_4_;
  DuplicateNameDetector::check(&local_180,nestedDecls,parentKind);
  std::
  _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_capnp::compiler::LocatedText::Reader>,_std::_Select1st<std::pair<const_kj::StringPtr,_capnp::compiler::LocatedText::Reader>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_capnp::compiler::LocatedText::Reader>_>_>
  ::~_Rb_tree(&local_180.names._M_t);
  if (decl._reader.pointerCount < 8) {
    local_208.pointers._0_4_ = 0x7fffffff;
    local_208.capTable = (CapTableReader *)0x0;
    local_208.data = (WirePointer *)0x0;
    local_208.segment = (SegmentReader *)0x0;
  }
  else {
    local_208.data = decl._reader.pointers + 7;
    local_208.capTable = decl._reader.capTable;
    local_208.segment = decl._reader.segment;
    local_208.pointers._0_4_ = decl._reader.nestingLimit;
  }
  capnp::_::PointerReader::getList
            ((ListReader *)&local_180,(PointerReader *)&local_208,INLINE_COMPOSITE,(word *)0x0);
  if ((ElementCount)local_180.names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != 0) {
    local_208.data = builder._builder.pointers + 5;
    local_208.segment = &(builder._builder.segment)->super_SegmentReader;
    local_208.capTable = &(builder._builder.capTable)->super_CapTableReader;
    capnp::_::PointerBuilder::initStructList
              ((ListBuilder *)local_1c8,(PointerBuilder *)&local_208,
               (ElementCount)local_180.names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
               (StructSize)0x10000);
    uVar11 = (ulong)local_180.names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent &
             0xffffffff;
    if (uVar11 != 0) {
      uVar9 = 0;
      do {
        capnp::_::ListBuilder::getStructElement
                  (&local_118,(ListBuilder *)local_1c8,(ElementCount)uVar9);
        capnp::_::ListReader::getStructElement
                  (&local_208,(ListReader *)&local_180,(ElementCount)uVar9);
        if (local_208.pointerCount == 0) {
          local_1a0.nestingLimit = 0x7fffffff;
          local_1a0.capTable = (CapTableReader *)0x0;
          local_1a0.pointer = (WirePointer *)0x0;
          local_1a0.segment = (SegmentReader *)0x0;
        }
        else {
          local_1a0.pointer =
               (WirePointer *)CONCAT44(local_208.pointers._4_4_,(int)local_208.pointers);
          local_1a0.capTable = local_208.capTable;
          local_1a0.segment = local_208.segment;
          local_1a0.nestingLimit = local_208.nestingLimit;
        }
        RVar13 = capnp::_::PointerReader::getBlob<capnp::Text>(&local_1a0,(void *)0x0,0);
        local_1a0.segment = &(local_118.segment)->super_SegmentReader;
        local_1a0.capTable = &(local_118.capTable)->super_CapTableReader;
        local_1a0.pointer = local_118.pointers;
        capnp::_::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_1a0,RVar13);
        uVar9 = uVar9 + 1;
      } while (uVar11 != uVar9);
    }
  }
  bVar1 = BrandScope::isGeneric((this->localBrand).ptr);
  *(byte *)((long)builder._builder.data + 0x24) =
       *(byte *)((long)builder._builder.data + 0x24) & 0xfe | bVar1;
  if (decl._reader.dataSize < 0x20) {
    uVar2 = 0;
  }
  else {
    uVar2 = *(undefined2 *)((long)decl._reader.data + 2);
  }
  sVar10 = 0xc;
  uVar8 = decl._reader.dataSize;
  switch(uVar2) {
  case 0:
    pcVar12 = "targetsFile";
    break;
  default:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32]>
              ((Fault *)&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
               ,0x2b2,FAILED,(char *)0x0,"\"This Declaration is not a node.\"",
               (char (*) [32])"This Declaration is not a node.");
    kj::_::Debug::Fault::fatal((Fault *)&local_208);
  case 2:
    *(undefined2 *)((long)builder._builder.data + 0xc) = 4;
    local_1cc = decl._reader.dataSize;
    local_208.data = builder._builder.pointers + 3;
    local_208.segment = &(builder._builder.segment)->super_SegmentReader;
    local_208.capTable = &(builder._builder.capTable)->super_CapTableReader;
    capnp::_::PointerBuilder::clear((PointerBuilder *)&local_208);
    uVar8 = local_1cc;
    local_208.data = builder._builder.pointers + 4;
    local_208.segment = &(builder._builder.segment)->super_SegmentReader;
    local_208.capTable = &(builder._builder.capTable)->super_CapTableReader;
    capnp::_::PointerBuilder::clear((PointerBuilder *)&local_208);
    compileConst(this,(Reader)decl._reader,(Builder)builder._builder);
    sVar10 = 0xd;
    pcVar12 = "targetsConst";
    break;
  case 3:
    if (decl._reader.pointerCount < 3) {
      local_208.pointers._0_4_ = 0x7fffffff;
      local_208.capTable = (CapTableReader *)0x0;
      local_208.data = (WirePointer *)0x0;
      local_208.segment = (SegmentReader *)0x0;
    }
    else {
      local_208.data = decl._reader.pointers + 2;
      local_208.capTable = decl._reader.capTable;
      local_208.segment = decl._reader.segment;
      local_208.pointers._0_4_ = decl._reader.nestingLimit;
    }
    capnp::_::PointerReader::getList
              (&local_60,(PointerReader *)&local_208,INLINE_COMPOSITE,(word *)0x0);
    compileEnum(this);
    pcVar12 = "targetsEnum";
    break;
  case 5:
    if (decl._reader.pointerCount < 3) {
      local_208.pointers._0_4_ = 0x7fffffff;
      local_208.capTable = (CapTableReader *)0x0;
      local_208.data = (WirePointer *)0x0;
      local_208.segment = (SegmentReader *)0x0;
    }
    else {
      local_208.data = decl._reader.pointers + 2;
      local_208.capTable = decl._reader.capTable;
      local_208.segment = decl._reader.segment;
      local_208.pointers._0_4_ = decl._reader.nestingLimit;
    }
    capnp::_::PointerReader::getList
              (&local_90,(PointerReader *)&local_208,INLINE_COMPOSITE,(word *)0x0);
    compileStruct(this);
    sVar10 = 0xe;
    pcVar12 = "targetsStruct";
    break;
  case 9:
    if (decl._reader.pointerCount < 3) {
      local_208.pointers._0_4_ = 0x7fffffff;
      local_208.capTable = (CapTableReader *)0x0;
      local_208.data = (WirePointer *)0x0;
      local_208.segment = (SegmentReader *)0x0;
    }
    else {
      local_208.data = decl._reader.pointers + 2;
      local_208.capTable = decl._reader.capTable;
      local_208.segment = decl._reader.segment;
      local_208.pointers._0_4_ = decl._reader.nestingLimit;
    }
    capnp::_::PointerReader::getList
              (&local_c0,(PointerReader *)&local_208,INLINE_COMPOSITE,(word *)0x0);
    members.reader.capTable = local_c0.capTable;
    members.reader.segment = local_c0.segment;
    members.reader.ptr = local_c0.ptr;
    members.reader.elementCount = local_c0.elementCount;
    members.reader.step = local_c0.step;
    members.reader.structDataSize = local_c0.structDataSize;
    members.reader.structPointerCount = local_c0.structPointerCount;
    members.reader.elementSize = local_c0.elementSize;
    members.reader._39_1_ = local_c0._39_1_;
    members.reader.nestingLimit = local_c0.nestingLimit;
    members.reader._44_4_ = local_c0._44_4_;
    compileInterface(this,(Reader)decl._reader,members,builder);
    sVar10 = 0x11;
    pcVar12 = "targetsInterface";
    break;
  case 0xb:
    *(undefined2 *)((long)builder._builder.data + 0xc) = 5;
    *(undefined1 *)((long)builder._builder.data + 0xe) = 0;
    *(byte *)((long)builder._builder.data + 0xf) =
         *(byte *)((long)builder._builder.data + 0xf) & 0xf0;
    local_208.data = builder._builder.pointers + 3;
    local_208.segment = &(builder._builder.segment)->super_SegmentReader;
    local_208.capTable = &(builder._builder.capTable)->super_CapTableReader;
    capnp::_::PointerBuilder::clear((PointerBuilder *)&local_208);
    compileAnnotation(this,(Reader)decl._reader,(Builder)builder._builder);
    sVar10 = 0x12;
    pcVar12 = "targetsAnnotation";
  }
  uVar3 = 0;
  uVar7 = 0;
  if (0x3f < uVar8) {
    uVar7 = *(undefined4 *)((long)decl._reader.data + 4);
  }
  *(undefined4 *)((long)builder._builder.data + 0x28) = uVar7;
  if (0x5f < uVar8) {
    uVar3 = *(undefined4 *)((long)decl._reader.data + 8);
  }
  *(undefined4 *)((long)builder._builder.data + 0x2c) = uVar3;
  if (decl._reader.pointerCount < 4) {
    local_208.pointers._0_4_ = 0x7fffffff;
    local_208.capTable = (CapTableReader *)0x0;
    local_208.data = (WirePointer *)0x0;
    local_208.segment = (SegmentReader *)0x0;
  }
  else {
    local_208.data = decl._reader.pointers + 3;
    local_208.capTable = decl._reader.capTable;
    local_208.segment = decl._reader.segment;
    local_208.pointers._0_4_ = decl._reader.nestingLimit;
  }
  capnp::_::PointerReader::getList
            (&local_f0,(PointerReader *)&local_208,INLINE_COMPOSITE,(word *)0x0);
  uVar7 = local_f0._36_4_;
  annotations.reader.capTable._0_4_ = (int)local_f0.capTable;
  annotations.reader.segment = local_f0.segment;
  annotations.reader.capTable._4_4_ = (int)((ulong)local_f0.capTable >> 0x20);
  annotations.reader.ptr._0_4_ = (int)local_f0.ptr;
  annotations.reader.ptr._4_4_ = (int)((ulong)local_f0.ptr >> 0x20);
  annotations.reader.elementCount = local_f0.elementCount;
  annotations.reader.step = local_f0.step;
  annotations.reader.structDataSize = local_f0.structDataSize;
  annotations.reader.structPointerCount = (short)uVar7;
  annotations.reader.elementSize = (char)((uint)uVar7 >> 0x10);
  annotations.reader._39_1_ = (char)((uint)uVar7 >> 0x18);
  annotations.reader.nestingLimit = local_f0.nestingLimit;
  annotations.reader._44_4_ = local_f0._44_4_;
  targetsFlagName.content.size_ = sVar10;
  targetsFlagName.content.ptr = pcVar12;
  compileAnnotationApplications
            ((Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> *)local_1c8,this,
             annotations,targetsFlagName);
  local_208.data = builder._builder.pointers + 2;
  local_208.segment = &(builder._builder.segment)->super_SegmentReader;
  local_208.capTable = &(builder._builder.capTable)->super_CapTableReader;
  capnp::_::PointerBuilder::adopt((PointerBuilder *)&local_208,(OrphanBuilder *)local_1c8);
  if ((SegmentBuilder *)local_1c8._8_8_ != (SegmentBuilder *)0x0) {
    capnp::_::OrphanBuilder::euthanize((OrphanBuilder *)local_1c8);
  }
  capnp::_::OrphanBuilder::asStruct
            ((StructBuilder *)local_1c8,&(this->sourceInfo).builder,(StructSize)0x20002);
  capnp::_::OrphanBuilder::asStructReader(&local_208,&(this->wipNode).builder,(StructSize)0x60006);
  if (local_208.dataSize < 0x40) {
    WVar6.offsetAndKind.value = 0;
    WVar6.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
  }
  else {
    WVar6 = *local_208.data;
  }
  *(WirePointer *)local_1c8._16_8_ = WVar6;
  if (decl._reader.pointerCount < 5) {
    local_208.segment = (SegmentReader *)0x0;
    local_208.capTable = (CapTableReader *)0x0;
    local_208.data = (WirePointer *)0x0;
    local_208.pointers._0_4_ = 0x7fffffff;
  }
  else {
    local_208.data = decl._reader.pointers + 4;
    local_208.segment = decl._reader.segment;
    local_208.capTable = decl._reader.capTable;
    local_208.pointers._0_4_ = decl._reader.nestingLimit;
  }
  PVar4 = capnp::_::PointerReader::getPointerType((PointerReader *)&local_208);
  if (PVar4 != NULL_) {
    if (decl._reader.pointerCount < 5) {
      decl._reader.nestingLimit = 0x7fffffff;
      decl._reader.capTable = (CapTableReader *)0x0;
      local_208.data = (WirePointer *)0x0;
      decl._reader.segment = (SegmentReader *)0x0;
    }
    else {
      local_208.data = decl._reader.pointers + 4;
    }
    local_208.segment = decl._reader.segment;
    local_208.capTable = decl._reader.capTable;
    local_208.pointers._0_4_ = decl._reader.nestingLimit;
    RVar13 = capnp::_::PointerReader::getBlob<capnp::Text>
                       ((PointerReader *)&local_208,(void *)0x0,0);
    local_208.segment = (SegmentReader *)local_1c8._0_8_;
    local_208.capTable = (CapTableReader *)local_1c8._8_8_;
    local_208.data = (void *)local_1c8._24_8_;
    capnp::_::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_208,RVar13);
  }
  uVar5 = 0;
  uVar8 = 0;
  if (0x3f < decl._reader.dataSize) {
    uVar8 = *(uint *)((long)decl._reader.data + 4);
  }
  (((WirePointer *)(local_1c8._16_8_ + 8))->offsetAndKind).value = uVar8;
  if (0x5f < decl._reader.dataSize) {
    uVar5 = *(uint32_t *)((long)decl._reader.data + 8);
  }
  (((WirePointer *)(local_1c8._16_8_ + 8))->field_1).upper32Bits = uVar5;
  return;
}

Assistant:

void NodeTranslator::compileNode(Declaration::Reader decl, schema::Node::Builder builder) {
  DuplicateNameDetector(errorReporter)
      .check(decl.getNestedDecls(), decl.which());

  auto genericParams = decl.getParameters();
  if (genericParams.size() > 0) {
    auto paramsBuilder = builder.initParameters(genericParams.size());
    for (auto i: kj::indices(genericParams)) {
      paramsBuilder[i].setName(genericParams[i].getName());
    }
  }

  builder.setIsGeneric(localBrand->isGeneric());

  kj::StringPtr targetsFlagName;

  switch (decl.which()) {
    case Declaration::FILE:
      targetsFlagName = "targetsFile";
      break;
    case Declaration::CONST:
      compileConst(decl.getConst(), builder.initConst());
      targetsFlagName = "targetsConst";
      break;
    case Declaration::ANNOTATION:
      compileAnnotation(decl.getAnnotation(), builder.initAnnotation());
      targetsFlagName = "targetsAnnotation";
      break;
    case Declaration::ENUM:
      compileEnum(decl.getEnum(), decl.getNestedDecls(), builder);
      targetsFlagName = "targetsEnum";
      break;
    case Declaration::STRUCT:
      compileStruct(decl.getStruct(), decl.getNestedDecls(), builder);
      targetsFlagName = "targetsStruct";
      break;
    case Declaration::INTERFACE:
      compileInterface(decl.getInterface(), decl.getNestedDecls(), builder);
      targetsFlagName = "targetsInterface";
      break;

    default:
      KJ_FAIL_REQUIRE("This Declaration is not a node.");
      break;
  }

  builder.setStartByte(decl.getStartByte());
  builder.setEndByte(decl.getEndByte());

  builder.adoptAnnotations(compileAnnotationApplications(decl.getAnnotations(), targetsFlagName));

  auto di = sourceInfo.get();
  di.setId(wipNode.getReader().getId());
  if (decl.hasDocComment()) {
    di.setDocComment(decl.getDocComment());
  }
  di.setStartByte(decl.getStartByte());
  di.setEndByte(decl.getEndByte());
}